

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

void __thiscall despot::Tag::Tag(Tag *this)

{
  int iVar1;
  OBS_TYPE OVar2;
  int rob;
  OBS_TYPE OVar3;
  OBS_TYPE OVar4;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string map;
  istringstream iss;
  
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__Tag_00121a10;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__Tag_00121b40;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__Tag_00121c48;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__Tag_00121c80;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__Tag_00121ca8;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"mapSize = 5 10\n",&local_2e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"#####...##\n",&local_2ea)
  ;
  std::operator+(&local_228,&local_248,&local_268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"#####...##\n",&local_2eb)
  ;
  std::operator+(&local_208,&local_228,&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"#####...##\n",&local_2ec)
  ;
  std::operator+(&local_1e8,&local_208,&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"...........\n",&local_2ed);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                 &local_1e8,&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"...........",&local_2ee);
  std::operator+(&map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                 &local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&iss);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&map,_S_in);
  BaseTag::Init(&this->super_BaseTag,(istream *)&iss);
  iVar1 = despot::Floor::NumCells();
  (this->super_BaseTag).same_loc_obs_ = (long)iVar1;
  iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->obs_,(long)iVar1);
  OVar3 = 0;
  while( true ) {
    iVar1 = despot::Floor::NumCells();
    if ((long)iVar1 <= (long)OVar3) break;
    OVar4 = 0;
    while( true ) {
      iVar1 = despot::Floor::NumCells();
      if (iVar1 <= (int)OVar4) break;
      iVar1 = despot::Floor::NumCells();
      OVar2 = OVar3;
      if (OVar3 == OVar4) {
        OVar2 = (this->super_BaseTag).same_loc_obs_;
      }
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1 * (int)OVar3 + (int)OVar4] = OVar2;
      OVar4 = OVar4 + 1;
    }
    OVar3 = OVar3 + 1;
  }
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&map);
  return;
}

Assistant:

Tag::Tag() {
	string map = string("mapSize = 5 10\n") + string("#####...##\n")
		+ string("#####...##\n") + string("#####...##\n")
		+ string("...........\n") + string("...........");
	istringstream iss(map);
	Init(iss);

	same_loc_obs_ = floor_.NumCells();
	obs_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			obs_[s] = (rob == opp ? same_loc_obs_ : rob);
		}
	}
  robot_pos_unknown_ = false;
}